

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_ARC(effect_handler_context_t *context)

{
  wchar_t typ;
  wchar_t wVar1;
  anon_enum_32 aVar2;
  uint8_t diameter_of_source;
  _Bool _Var3;
  wchar_t dam;
  wchar_t wVar4;
  wchar_t degrees_of_arc;
  wchar_t flg;
  wchar_t rad;
  source origin;
  loc target;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  typ = context->subtype;
  rad = context->radius;
  target = (loc)loc(-1,-1);
  wVar1 = context->other;
  degrees_of_arc = L'\x14';
  if (L'\x14' < wVar1) {
    degrees_of_arc = wVar1;
  }
  if (rad == L'\0') {
    rad = (wchar_t)z_info->max_range;
  }
  aVar2 = (context->origin).what;
  flg = L'Ѱ';
  if (aVar2 == SRC_PLAYER) {
    wVar4 = context->dir;
    if (wVar4 == L'\x05') {
      _Var3 = target_okay();
      if (_Var3) {
        target_get((loc_conflict *)&target);
        goto LAB_0013a220;
      }
      wVar4 = context->dir;
    }
    target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[wVar4]);
  }
  else if (aVar2 == SRC_MONSTER) {
    target.x = (player->grid).x;
    target.y = (player->grid).y;
    flg = L'౰';
  }
LAB_0013a220:
  diameter_of_source = '\x04';
  if (wVar1 < L'<') {
    diameter_of_source = (uint8_t)(0xf0 / (byte)degrees_of_arc);
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var3 = project(origin,rad,target,dam,typ,flg,degrees_of_arc,diameter_of_source,context->obj);
  if (_Var3) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_ARC(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int type = context->subtype;
	int rad = context->radius;

	struct loc target = loc(-1, -1);

	/* Diameter of source starts at 4, so full strength up to 3 grids from
	 * the caster. */
	int diameter_of_source = 4;

	/* Short beams now have their own effect, so we set a minimum arc width */
	int degrees_of_arc = MAX(context->other, 20);

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Radius of zero means no fixed limit. */
	if (rad == 0) {
		rad = z_info->max_range;
	}

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		flg |= PROJECT_PLAY;
		target =  player->grid;
	} else if (context->origin.what == SRC_PLAYER) {
		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Diameter of the energy source. */
	if (degrees_of_arc < 60) {
			diameter_of_source = diameter_of_source * 60 / degrees_of_arc;
	}

	/* Max */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Aim at the target */
	if (project(context->origin, rad, target, dam, type, flg, degrees_of_arc,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}